

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTetrahedronFace.h
# Opt level: O3

bool __thiscall chrono::fea::ChTetrahedronFace::IsSubBlockActive(ChTetrahedronFace *this,int nblock)

{
  byte bVar1;
  undefined1 local_18 [16];
  
  GetNodeN((ChTetrahedronFace *)local_18,(int)this);
  bVar1 = (**(code **)(*(long *)local_18._0_8_ + 0x18))();
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_18._8_8_);
  }
  return (bool)(bVar1 ^ 1);
}

Assistant:

virtual bool IsSubBlockActive(int nblock) const override { return !GetNodeN(nblock)->GetFixed(); }